

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O3

QSurfaceFormat
q_glFormatFromConfig(EGLDisplay display,EGLConfig config,QSurfaceFormat *referenceFormat)

{
  RenderableType RVar1;
  OpenGLModuleType OVar2;
  int interval;
  char *pcVar3;
  QSurfaceFormat *in_RCX;
  long in_FS_OFFSET;
  EGLint renderableType;
  EGLint sampleCount;
  EGLint stencilSize;
  EGLint depthSize;
  EGLint alphaSize;
  EGLint blueSize;
  EGLint greenSize;
  EGLint redSize;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)display = &DAT_aaaaaaaaaaaaaaaa;
  QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)display);
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  eglGetConfigAttrib(config,referenceFormat,0x3024);
  eglGetConfigAttrib(config,referenceFormat,0x3023,&local_40);
  eglGetConfigAttrib(config,referenceFormat,0x3022,&local_44);
  eglGetConfigAttrib(config,referenceFormat,0x3021,&local_48);
  eglGetConfigAttrib(config,referenceFormat,0x3025,&local_4c);
  eglGetConfigAttrib(config,referenceFormat,0x3026,&local_50);
  eglGetConfigAttrib(config,referenceFormat,0x3031,&local_54);
  eglGetConfigAttrib(config,referenceFormat,0x3040,&local_58);
  RVar1 = QSurfaceFormat::renderableType(in_RCX);
  if ((RVar1 != OpenVG) || (RVar1 = OpenVG, (local_58 & 2) == 0)) {
    RVar1 = QSurfaceFormat::renderableType(in_RCX);
    if ((RVar1 != OpenGL) || (RVar1 = OpenGL, (local_58 & 8) == 0)) {
      RVar1 = QSurfaceFormat::renderableType(in_RCX);
      if (RVar1 == DefaultRenderableType) {
        OVar2 = QOpenGLContext::openGLModuleType();
        if (OVar2 == LibGL) {
          pcVar3 = (char *)eglQueryString(config,0x3053);
          pcVar3 = strstr(pcVar3,"NVIDIA");
          if ((pcVar3 == (char *)0x0) && (RVar1 = OpenGL, (local_58 & 8) != 0)) goto LAB_0057e820;
        }
      }
      RVar1 = OpenGLES;
    }
  }
LAB_0057e820:
  QSurfaceFormat::setRenderableType((QSurfaceFormat *)display,RVar1);
  QSurfaceFormat::setRedBufferSize((QSurfaceFormat *)display,local_3c);
  QSurfaceFormat::setGreenBufferSize((QSurfaceFormat *)display,local_40);
  QSurfaceFormat::setBlueBufferSize((QSurfaceFormat *)display,local_44);
  QSurfaceFormat::setAlphaBufferSize((QSurfaceFormat *)display,local_48);
  QSurfaceFormat::setDepthBufferSize((QSurfaceFormat *)display,local_4c);
  QSurfaceFormat::setStencilBufferSize((QSurfaceFormat *)display,local_50);
  QSurfaceFormat::setSamples((QSurfaceFormat *)display,local_54);
  QSurfaceFormat::setStereo((QSurfaceFormat *)display,false);
  interval = QSurfaceFormat::swapInterval(in_RCX);
  QSurfaceFormat::setSwapInterval((QSurfaceFormat *)display,interval);
  eglGetError();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSurfaceFormat)(QSurfaceFormatPrivate *)display;
  }
  __stack_chk_fail();
}

Assistant:

QSurfaceFormat q_glFormatFromConfig(EGLDisplay display, const EGLConfig config, const QSurfaceFormat &referenceFormat)
{
    QSurfaceFormat format;
    EGLint redSize     = 0;
    EGLint greenSize   = 0;
    EGLint blueSize    = 0;
    EGLint alphaSize   = 0;
    EGLint depthSize   = 0;
    EGLint stencilSize = 0;
    EGLint sampleCount = 0;
    EGLint renderableType = 0;

    eglGetConfigAttrib(display, config, EGL_RED_SIZE,     &redSize);
    eglGetConfigAttrib(display, config, EGL_GREEN_SIZE,   &greenSize);
    eglGetConfigAttrib(display, config, EGL_BLUE_SIZE,    &blueSize);
    eglGetConfigAttrib(display, config, EGL_ALPHA_SIZE,   &alphaSize);
    eglGetConfigAttrib(display, config, EGL_DEPTH_SIZE,   &depthSize);
    eglGetConfigAttrib(display, config, EGL_STENCIL_SIZE, &stencilSize);
    eglGetConfigAttrib(display, config, EGL_SAMPLES,      &sampleCount);
    eglGetConfigAttrib(display, config, EGL_RENDERABLE_TYPE, &renderableType);

    if (referenceFormat.renderableType() == QSurfaceFormat::OpenVG && (renderableType & EGL_OPENVG_BIT))
        format.setRenderableType(QSurfaceFormat::OpenVG);
#ifdef EGL_VERSION_1_4
    else if (referenceFormat.renderableType() == QSurfaceFormat::OpenGL
             && (renderableType & EGL_OPENGL_BIT))
        format.setRenderableType(QSurfaceFormat::OpenGL);
    else if (referenceFormat.renderableType() == QSurfaceFormat::DefaultRenderableType
#ifndef QT_NO_OPENGL
             && QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
             && !strstr(eglQueryString(display, EGL_VENDOR), "NVIDIA")
#endif
             && (renderableType & EGL_OPENGL_BIT))
        format.setRenderableType(QSurfaceFormat::OpenGL);
#endif
    else
        format.setRenderableType(QSurfaceFormat::OpenGLES);

    format.setRedBufferSize(redSize);
    format.setGreenBufferSize(greenSize);
    format.setBlueBufferSize(blueSize);
    format.setAlphaBufferSize(alphaSize);
    format.setDepthBufferSize(depthSize);
    format.setStencilBufferSize(stencilSize);
    format.setSamples(sampleCount);
    format.setStereo(false);         // EGL doesn't support stereo buffers
    format.setSwapInterval(referenceFormat.swapInterval());

    // Clear the EGL error state because some of the above may
    // have errored out because the attribute is not applicable
    // to the surface type.  Such errors don't matter.
    eglGetError();

    return format;
}